

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcborvalue.cpp
# Opt level: O2

void __thiscall QCborValue::QCborValue(QCborValue *this,QByteArray *ba)

{
  QCborContainerPrivate *this_00;
  char *data;
  
  *(undefined8 *)this = 0;
  this_00 = (QCborContainerPrivate *)operator_new(0x40);
  (this_00->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value
  .super___atomic_base<int>._M_i = 0;
  this_00->usedData = 0;
  (this_00->data).d.d = (Data *)0x0;
  (this_00->data).d.ptr = (char *)0x0;
  (this_00->data).d.size = 0;
  (this_00->elements).d.d = (Data *)0x0;
  (this_00->elements).d.ptr = (Element *)0x0;
  (this_00->elements).d.size = 0;
  *(QCborContainerPrivate **)(this + 8) = this_00;
  *(undefined4 *)(this + 0x10) = 0x40;
  data = (ba->d).ptr;
  if (data == (char *)0x0) {
    data = &QByteArray::_empty;
  }
  QCborContainerPrivate::appendByteData(this_00,data,(ba->d).size,ByteArray,(ValueFlags)0x0);
  **(undefined4 **)(this + 8) = 1;
  return;
}

Assistant:

QCborValue::QCborValue(const QByteArray &ba)
    : n(0), container(new QCborContainerPrivate), t(ByteArray)
{
    container->appendByteData(ba.constData(), ba.size(), t);
    container->ref.storeRelaxed(1);
}